

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall
helics::CoreBroker::connectInterfaces
          (CoreBroker *this,BasicHandleInfo *origin,uint32_t originFlags,BasicHandleInfo *target,
          uint32_t targetFlags,
          pair<helics::action_message_def::action_t,_helics::action_message_def::action_t> actions)

{
  byte *pbVar1;
  size_type sVar2;
  size_t size;
  long *plVar3;
  undefined4 fedid;
  route_id rVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pbVar6;
  undefined1 auVar7 [16];
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  undefined1 local_e8 [8];
  undefined1 local_e0 [12];
  InterfaceHandle IStack_d4;
  uint16_t local_ce;
  SmallBuffer local_a8;
  pointer local_48;
  pointer local_40;
  
  ActionMessage::ActionMessage((ActionMessage *)local_e8,actions.first);
  local_e0._8_4_ = (target->handle).fed_id.gid;
  local_e0._0_4_ = (origin->handle).fed_id;
  local_e0._4_4_ = (origin->handle).handle;
  IStack_d4.hid = (target->handle).handle.hid;
  local_ce = (uint16_t)originFlags;
  pbVar1 = (byte *)(origin->key)._M_dataplus._M_p;
  local_a8.bufferSize = (origin->key)._M_string_length;
  if ((local_a8.heap != pbVar1) &&
     (SmallBuffer::reserve(&local_a8,local_a8.bufferSize), local_a8.bufferSize != 0)) {
    memcpy(local_a8.heap,pbVar1,local_a8.bufferSize);
  }
  sVar2 = (origin->type)._M_string_length;
  if (sVar2 != 0) {
    str._M_str = (origin->type)._M_dataplus._M_p;
    str._M_len = sVar2;
    ActionMessage::setString((ActionMessage *)local_e8,0,str);
  }
  sVar2 = (origin->units)._M_string_length;
  if (sVar2 != 0) {
    str_00._M_str = (origin->units)._M_dataplus._M_p;
    str_00._M_len = sVar2;
    ActionMessage::setString((ActionMessage *)local_e8,1,str_00);
  }
  rVar4 = getRoute(this,(GlobalFederateId)local_e0._8_4_);
  (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar4.rid,local_e8);
  ActionMessage::setAction((ActionMessage *)local_e8,actions.second);
  pbVar1 = (byte *)(target->key)._M_dataplus._M_p;
  size = (target->key)._M_string_length;
  if ((local_a8.heap != pbVar1) && (SmallBuffer::reserve(&local_a8,size), size != 0)) {
    local_a8.bufferSize = size;
    memcpy(local_a8.heap,pbVar1,size);
    size = local_a8.bufferSize;
  }
  local_a8.bufferSize = size;
  if (local_40 != local_48) {
    paVar5 = &local_48->field_2;
    do {
      plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (paVar5 + -1))->_M_dataplus)._M_p;
      if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar3) {
        operator_delete(plVar3,paVar5->_M_allocated_capacity + 1);
      }
      pbVar6 = (pointer)(paVar5 + 1);
      paVar5 = paVar5 + 2;
    } while (pbVar6 != local_40);
    local_40 = local_48;
  }
  sVar2 = (target->type)._M_string_length;
  if (sVar2 != 0) {
    str_01._M_str = (target->type)._M_dataplus._M_p;
    str_01._M_len = sVar2;
    ActionMessage::setString((ActionMessage *)local_e8,0,str_01);
  }
  sVar2 = (target->units)._M_string_length;
  if (sVar2 != 0) {
    str_02._M_str = (target->units)._M_dataplus._M_p;
    str_02._M_len = sVar2;
    ActionMessage::setString((ActionMessage *)local_e8,1,str_02);
  }
  local_ce = (uint16_t)targetFlags;
  fedid = local_e0._0_4_;
  auVar7._0_8_ = local_e0._8_8_;
  auVar7._8_4_ = local_e0._0_4_;
  auVar7._12_4_ = local_e0._4_4_;
  _local_e0 = auVar7;
  rVar4 = getRoute(this,(GlobalFederateId)fedid);
  (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar4.rid,local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)local_e8);
  return;
}

Assistant:

void CoreBroker::connectInterfaces(
    const BasicHandleInfo& origin,
    uint32_t originFlags,
    const BasicHandleInfo& target,
    uint32_t targetFlags,
    std::pair<action_message_def::action_t, action_message_def::action_t> actions)
{
    // notify the target about an origin
    ActionMessage connect(actions.first);
    connect.setSource(origin.handle);
    connect.setDestination(target.handle);
    connect.flags = originFlags;
    connect.name(origin.key);
    if (!origin.type.empty()) {
        connect.setString(typeStringLoc, origin.type);
    }
    if (!origin.units.empty()) {
        connect.setString(unitStringLoc, origin.units);
    }
    transmit(getRoute(connect.dest_id), connect);

    connect.setAction(actions.second);
    connect.name(target.key);
    connect.clearStringData();
    if (!target.type.empty()) {
        connect.setString(typeStringLoc, target.type);
    }
    if (!target.units.empty()) {
        connect.setString(unitStringLoc, target.units);
    }

    connect.flags = targetFlags;

    connect.swapSourceDest();
    transmit(getRoute(connect.dest_id), connect);
}